

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O0

void __thiscall Pl_DCT::finish(Pl_DCT *this)

{
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  Buffer *this_00;
  size_t sVar4;
  Pipeline *pPVar5;
  runtime_error *this_01;
  exception *e;
  bool error;
  undefined1 local_680 [8];
  qpdf_jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo_decompress;
  jpeg_compress_struct cinfo_compress;
  Buffer *b;
  Pl_DCT *this_local;
  
  pMVar3 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                     (&this->m);
  Pl_Buffer::finish(&pMVar3->buf);
  pMVar3 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                     (&this->m);
  this_00 = Pl_Buffer::getBuffer(&pMVar3->buf);
  sVar4 = Buffer::getSize(this_00);
  if (sVar4 == 0) {
    if (this_00 != (Buffer *)0x0) {
      Buffer::~Buffer(this_00);
      operator_delete(this_00,8);
    }
    pPVar5 = Pipeline::next(&this->super_Pipeline);
    (*pPVar5->_vptr_Pipeline[3])();
  }
  else {
    anon_unknown.dwarf_d1c5a::qpdf_jpeg_error_mgr::qpdf_jpeg_error_mgr
              ((qpdf_jpeg_error_mgr *)local_680);
    cinfo_decompress.cquantize =
         (jpeg_color_quantizer *)jpeg_std_error((qpdf_jpeg_error_mgr *)local_680);
    jerr.msg.field_2._8_8_ = jpeg_std_error(local_680);
    local_680 = (undefined1  [8])error_handler;
    pMVar3 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                       (&this->m);
    if ((pMVar3->action == a_decompress) &&
       (((anonymous_namespace)::throw_on_corrupt_data & 1) != 0)) {
      jerr.pub.error_exit = emit_message;
    }
    bVar1 = false;
    iVar2 = _setjmp((__jmp_buf_tag *)&jerr.pub.first_addon_message);
    if (iVar2 == 0) {
      pMVar3 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                         (&this->m);
      if (pMVar3->action == a_compress) {
        compress(this,&cinfo_decompress.cquantize,this_00);
      }
      else {
        decompress(this,(void *)((long)&jerr.msg.field_2 + 8),this_00);
      }
    }
    else {
      bVar1 = true;
    }
    if (this_00 != (Buffer *)0x0) {
      Buffer::~Buffer(this_00);
      operator_delete(this_00,8);
    }
    pMVar3 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                       (&this->m);
    if (pMVar3->action == a_compress) {
      jpeg_destroy_compress(&cinfo_decompress.cquantize);
    }
    pMVar3 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                       (&this->m);
    if (pMVar3->action == a_decompress) {
      jpeg_destroy_decompress((undefined1 *)((long)&jerr.msg.field_2 + 8));
    }
    if (bVar1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)(jerr.jmpbuf[0].__saved_mask.__val + 0xf))
      ;
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    anon_unknown.dwarf_d1c5a::qpdf_jpeg_error_mgr::~qpdf_jpeg_error_mgr
              ((qpdf_jpeg_error_mgr *)local_680);
  }
  return;
}

Assistant:

void
Pl_DCT::finish()
{
    m->buf.finish();

    // Using a std::shared_ptr<Buffer> here and passing it into compress and decompress causes a
    // memory leak with setjmp/longjmp. Just use a pointer and delete it.
    Buffer* b = m->buf.getBuffer();
    if (b->getSize() == 0) {
        // Special case: empty data will never succeed and probably means we're calling finish a
        // second time from an exception handler.
        delete b;
        next()->finish();
        return;
    }

    struct jpeg_compress_struct cinfo_compress;
    struct jpeg_decompress_struct cinfo_decompress;
    struct qpdf_jpeg_error_mgr jerr;

    cinfo_compress.err = jpeg_std_error(&(jerr.pub));
    cinfo_decompress.err = jpeg_std_error(&(jerr.pub));
    jerr.pub.error_exit = error_handler;
    if (m->action == a_decompress && throw_on_corrupt_data) {
        jerr.pub.emit_message = emit_message;
    }

    bool error = false;
    // The jpeg library is a "C" library, so we use setjmp and longjmp for exception handling.
    if (setjmp(jerr.jmpbuf) == 0) {
        try {
            if (m->action == a_compress) {
                compress(reinterpret_cast<void*>(&cinfo_compress), b);
            } else {
                decompress(reinterpret_cast<void*>(&cinfo_decompress), b);
            }
        } catch (std::exception& e) {
            // Convert an exception back to a longjmp so we can ensure that the right cleanup
            // happens. This will get converted back to an exception.
            jerr.msg = e.what();
            longjmp(jerr.jmpbuf, 1);
        }
    } else {
        error = true;
    }
    delete b;

    if (m->action == a_compress) {
        jpeg_destroy_compress(&cinfo_compress);
    }
    if (m->action == a_decompress) {
        jpeg_destroy_decompress(&cinfo_decompress);
    }
    if (error) {
        throw std::runtime_error(jerr.msg);
    }
}